

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

uint32_t __thiscall cfd::Psbt::AddTxIn(Psbt *this,OutPoint *outpoint,uint32_t sequence)

{
  uint32_t uVar1;
  uint32_t in_EDX;
  OutPoint *in_RSI;
  Psbt *in_RDI;
  Txid local_38;
  uint32_t local_14;
  OutPoint *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  core::OutPoint::GetTxid(&local_38,in_RSI);
  uVar1 = core::OutPoint::GetVout(local_10);
  uVar1 = core::Psbt::AddTxIn(in_RDI,&local_38,uVar1,local_14);
  core::Txid::~Txid((Txid *)0x51d3f2);
  return uVar1;
}

Assistant:

uint32_t Psbt::AddTxIn(const OutPoint& outpoint, uint32_t sequence) {
  return cfd::core::Psbt::AddTxIn(
      outpoint.GetTxid(), outpoint.GetVout(), sequence);
}